

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O0

void serialization::unserialize_helper<serialization::xml_iarchive,std::__cxx11::string,Person>
               (xml_iarchive *ar,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
               *v)

{
  int local_20;
  serialization_trace local_19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  *ppStack_18;
  serialization_trace trace;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  *v_local;
  xml_iarchive *ar_local;
  
  local_20 = 0x87;
  ppStack_18 = v;
  serialization_trace::serialization_trace<char_const(&)[19],char_const(&)[140],int>
            (&local_19,(char (*) [19])"unserialize_helper",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_helper.h"
             ,&local_20);
  xml_iarchive::load_object_start(ar);
  xml_iarchive::load_key_start(ar,"first");
  unserialize_helper<serialization::xml_iarchive,std::__cxx11::string>(ar,&ppStack_18->first);
  xml_iarchive::load_key_end(ar,"first");
  xml_iarchive::load_key_start(ar,"second");
  unserialize_helper<serialization::xml_iarchive,Person>(ar,&ppStack_18->second);
  xml_iarchive::load_key_end(ar,"second");
  xml_iarchive::load_object_end(ar);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::pair<Key, Value> & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);
    ar.load_object_start();

    ar.load_key_start("first");
    unserialize_helper(ar, v.first);
    ar.load_key_end("first");

    ar.load_key_start("second");
    unserialize_helper(ar, v.second);
    ar.load_key_end("second");

    ar.load_object_end();
}